

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall
despot::util::tinyxml::TiXmlComment::TiXmlComment(TiXmlComment *this,TiXmlComment *copy)

{
  TiXmlComment *copy_local;
  TiXmlComment *this_local;
  
  TiXmlNode::TiXmlNode(&this->super_TiXmlNode,COMMENT);
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlComment_0026f530;
  CopyTo(copy,this);
  return;
}

Assistant:

TiXmlComment::TiXmlComment(const TiXmlComment& copy) :
	TiXmlNode(TiXmlNode::COMMENT) {
	copy.CopyTo(this);
}